

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJsonObjects.cxx
# Opt level: O1

Value * cmDumpCodeModel(Value *__return_storage_ptr__,cmake *cm)

{
  cmMakefile *this;
  _Base_ptr p_Var1;
  long *plVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  long *plVar5;
  undefined8 *puVar6;
  string *psVar7;
  cmake *pcVar8;
  bool bVar9;
  Value *pVVar10;
  char *value;
  string *psVar11;
  ulong uVar12;
  long lVar13;
  cmake *cm_00;
  cmLocalGenerator **lgIt;
  _Base_ptr p_Var14;
  bool bVar15;
  bool bVar16;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targetList;
  Value pObj;
  _Rb_tree_node_base *local_270;
  undefined8 *local_268;
  undefined8 *puStack_260;
  long local_258;
  Value *local_250;
  ValueHolder local_248;
  undefined8 *local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  string *local_220;
  string *local_218;
  cmake *local_210;
  _Rb_tree_node_base *local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  Value local_1e8;
  Value local_1c0;
  Value local_198;
  Value local_170;
  Value local_148;
  Value local_120;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  local_250 = __return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_1e8,arrayValue);
  (anonymous_namespace)::getConfigurations_abi_cxx11_(&local_200,(_anonymous_namespace_ *)cm,cm_00);
  local_218 = local_200.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  psVar11 = local_200.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pcVar8 = cm;
  if (local_200.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_200.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_210 = pcVar8;
      Json::Value::Value(&local_148,objectValue);
      Json::Value::Value(&local_120,psVar11);
      pVVar10 = Json::Value::operator[](&local_148,&kNAME_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar10,&local_120);
      Json::Value::~Value(&local_120);
      Json::Value::Value(&local_198,arrayValue);
      local_270 = (cm->GlobalGenerator->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
      local_208 = &(cm->GlobalGenerator->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header;
      psVar7 = psVar11;
      if (local_270 != local_208) {
        do {
          local_220 = psVar7;
          Json::Value::Value(&local_1c0,objectValue);
          Json::Value::Value(&local_80,(string *)(local_270 + 1));
          pVVar10 = Json::Value::operator[](&local_1c0,&kNAME_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar10,&local_80);
          Json::Value::~Value(&local_80);
          if (*(_Base_ptr *)(local_270 + 2) == local_270[2]._M_parent) {
            __assert_fail("!projectIt.second.empty()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmJsonObjects.cxx"
                          ,0x276,"Json::Value DumpProjectList(const cmake *, const std::string &)");
          }
          this = *(cmMakefile **)(*(long *)*(_Base_ptr *)(local_270 + 2) + 0x28);
          local_248.string_ = (char *)&local_238;
          local_268 = (undefined8 *)0x1e;
          local_248.int_ = std::__cxx11::string::_M_create(&local_248.uint_,(ulong)&local_268);
          local_238._M_allocated_capacity = (size_type)local_268;
          (((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header.field_0x6 = 'R';
          (((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header.field_0x7 = 'E';
          *(char *)&(((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header._M_parent =
               'Q';
          *(char *)((long)&(((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header.
                           _M_parent + 1) = 'U';
          *(char *)((long)&(((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header.
                           _M_parent + 2) = 'I';
          *(char *)((long)&(((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header.
                           _M_parent + 3) = 'R';
          *(char *)((long)&(((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header.
                           _M_parent + 4) = 'E';
          *(char *)((long)&(((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header.
                           _M_parent + 5) = 'D';
          builtin_strncpy((char *)((long)&(local_248.map_)->_M_t + 0x16),"_VERSION",8);
          builtin_strncpy((char *)local_248,"CMAKE_MI",8);
          *(char *)&(((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header._M_color =
               'N';
          *(char *)((long)&(((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header.
                           _M_color + 1) = 'I';
          *(char *)((long)&(((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header.
                           _M_color + 2) = 'M';
          *(char *)((long)&(((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header.
                           _M_color + 3) = 'U';
          (((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header.field_0x4 = 'M';
          (((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header.field_0x5 = '_';
          (((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header.field_0x6 = 'R';
          (((_Rep_type *)local_248)->_M_impl).super__Rb_tree_header._M_header.field_0x7 = 'E';
          local_240 = local_268;
          local_248.string_[(long)local_268] = '\0';
          value = cmMakefile::GetDefinition(this,(string *)&local_248);
          if (local_248 != &local_238) {
            operator_delete(local_248.string_,local_238._M_allocated_capacity + 1);
          }
          if (value == (char *)0x0) {
            value = "";
          }
          Json::Value::Value(&local_58,value);
          pVVar10 = Json::Value::operator[](&local_1c0,&kMINIMUM_CMAKE_VERSION_abi_cxx11_);
          Json::Value::operator=(pVVar10,&local_58);
          Json::Value::~Value(&local_58);
          psVar11 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
          Json::Value::Value(&local_a8,psVar11);
          pVVar10 = Json::Value::operator[](&local_1c0,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar10,&local_a8);
          Json::Value::~Value(&local_a8);
          psVar11 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
          Json::Value::Value(&local_d0,psVar11);
          pVVar10 = Json::Value::operator[](&local_1c0,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar10,&local_d0);
          Json::Value::~Value(&local_d0);
          Json::Value::Value(&local_170,arrayValue);
          local_268 = (undefined8 *)0x0;
          puStack_260 = (undefined8 *)0x0;
          local_258 = 0;
          p_Var1 = local_270[2]._M_parent;
          for (p_Var14 = *(_Base_ptr *)(local_270 + 2); puVar4 = puStack_260, puVar3 = local_268,
              p_Var14 != p_Var1; p_Var14 = (_Base_ptr)&p_Var14->_M_parent) {
            std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>>
                      ((vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *)&local_268,
                       puStack_260,*(undefined8 *)(*(long *)p_Var14 + 0x100));
          }
          psVar11 = local_220;
          if (local_268 != puStack_260) {
            uVar12 = (long)puStack_260 - (long)local_268 >> 3;
            lVar13 = 0x3f;
            if (uVar12 != 0) {
              for (; uVar12 >> lVar13 == 0; lVar13 = lVar13 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_268,puStack_260,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (puVar3,puVar4);
            puVar3 = local_268;
            puVar4 = puStack_260;
            psVar11 = local_220;
          }
          for (; psVar7 = local_220, puVar6 = puStack_260, local_220 = psVar11,
              puVar3 != puStack_260; puVar3 = puVar3 + 1) {
            puStack_260 = puVar4;
            DumpTarget((Value *)&local_248,(cmGeneratorTarget *)*puVar3,psVar7);
            bVar9 = Json::Value::isNull((Value *)&local_248);
            if (!bVar9) {
              Json::Value::append(&local_170,(Value *)&local_248);
            }
            Json::Value::~Value((Value *)&local_248);
            puVar4 = puStack_260;
            psVar11 = local_220;
            local_220 = psVar7;
            puStack_260 = puVar6;
          }
          puStack_260 = puVar4;
          if (local_268 != (undefined8 *)0x0) {
            operator_delete(local_268,local_258 - (long)local_268);
          }
          pVVar10 = Json::Value::operator[](&local_1c0,&kTARGETS_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar10,&local_170);
          Json::Value::~Value(&local_170);
          p_Var1 = local_270[2]._M_parent;
          bVar15 = false;
          bVar9 = false;
          for (p_Var14 = *(_Base_ptr *)(local_270 + 2); p_Var14 != p_Var1;
              p_Var14 = (_Base_ptr)&p_Var14->_M_parent) {
            plVar2 = *(long **)(*(long *)(*(long *)p_Var14 + 0x28) + 0x208);
            plVar5 = *(long **)(*(long *)(*(long *)p_Var14 + 0x28) + 0x200);
            do {
              if (plVar5 == plVar2) goto LAB_003ae77b;
              if (*plVar5 == 0) {
                bVar16 = true;
              }
              else {
                lVar13 = __dynamic_cast(*plVar5,&cmInstallGenerator::typeinfo,
                                        &cmInstallSubdirectoryGenerator::typeinfo,0);
                bVar16 = lVar13 == 0;
              }
              plVar5 = plVar5 + 1;
              bVar9 = bVar15;
            } while (!bVar16);
            bVar9 = true;
            bVar15 = bVar9;
LAB_003ae77b:
            if (bVar9) break;
          }
          Json::Value::Value(&local_f8,bVar9);
          cm = local_210;
          psVar11 = local_220;
          pVVar10 = Json::Value::operator[](&local_1c0,&kHAS_INSTALL_RULE_abi_cxx11_);
          Json::Value::operator=(pVVar10,&local_f8);
          Json::Value::~Value(&local_f8);
          Json::Value::append(&local_198,&local_1c0);
          Json::Value::~Value(&local_1c0);
          local_270 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_270);
          psVar7 = local_220;
        } while (local_270 != local_208);
      }
      pVVar10 = Json::Value::operator[](&local_148,&kPROJECTS_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar10,&local_198);
      Json::Value::~Value(&local_198);
      Json::Value::append(&local_1e8,&local_148);
      Json::Value::~Value(&local_148);
      psVar11 = psVar11 + 1;
      pcVar8 = local_210;
    } while (psVar11 != local_218);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_200);
  pVVar10 = Json::Value::operator[](local_250,&kCONFIGURATIONS_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar10,&local_1e8);
  Json::Value::~Value(&local_1e8);
  return local_250;
}

Assistant:

Json::Value cmDumpCodeModel(const cmake* cm)
{
  Json::Value result = Json::objectValue;
  result[kCONFIGURATIONS_KEY] = DumpConfigurationsList(cm);
  return result;
}